

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O2

CURLcode curl_mime_data(curl_mimepart *part,char *ptr,size_t datasize)

{
  char *pcVar1;
  CURLcode CVar2;
  
  if (part == (curl_mimepart *)0x0) {
    CVar2 = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  else {
    cleanup_part_content(part);
    CVar2 = CURLE_OK;
    if (ptr != (char *)0x0) {
      if (datasize == 0xffffffffffffffff) {
        datasize = strlen(ptr);
      }
      pcVar1 = (char *)Curl_memdup0(ptr,datasize);
      part->data = pcVar1;
      if (pcVar1 == (char *)0x0) {
        CVar2 = CURLE_OUT_OF_MEMORY;
      }
      else {
        part->datasize = datasize;
        part->readfunc = mime_mem_read;
        part->seekfunc = mime_mem_seek;
        part->freefunc = mime_mem_free;
        *(byte *)&part->flags = (byte)part->flags | 4;
        part->kind = MIMEKIND_DATA;
      }
    }
  }
  return CVar2;
}

Assistant:

CURLcode curl_mime_data(curl_mimepart *part,
                        const char *ptr, size_t datasize)
{
  if(!part)
    return CURLE_BAD_FUNCTION_ARGUMENT;

  cleanup_part_content(part);

  if(ptr) {
    if(datasize == CURL_ZERO_TERMINATED)
      datasize = strlen(ptr);

    part->data = Curl_memdup0(ptr, datasize);
    if(!part->data)
      return CURLE_OUT_OF_MEMORY;

    part->datasize = datasize;
    part->readfunc = mime_mem_read;
    part->seekfunc = mime_mem_seek;
    part->freefunc = mime_mem_free;
    part->flags |= MIME_FAST_READ;
    part->kind = MIMEKIND_DATA;
  }

  return CURLE_OK;
}